

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

bool __thiscall TCLAP::CmdLine::_emptyCombined(CmdLine *this,string *s)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ulong in_RSI;
  int i;
  uint local_1c;
  
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    cVar1 = *pcVar4;
    cVar2 = Arg::flagStartChar();
    if (cVar1 != cVar2) {
      return false;
    }
  }
  local_1c = 1;
  while( true ) {
    uVar5 = std::__cxx11::string::length();
    if (uVar5 <= local_1c) {
      return true;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    cVar1 = *pcVar4;
    cVar2 = Arg::blankChar();
    if (cVar1 != cVar2) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

inline bool CmdLine::_emptyCombined(const std::string& s)
{
	if ( s.length() > 0 && s[0] != Arg::flagStartChar() )
		return false;

	for ( int i = 1; static_cast<unsigned int>(i) < s.length(); i++ )
		if ( s[i] != Arg::blankChar() )
			return false;

	return true;
}